

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::GRULayerParams::SharedDtor(GRULayerParams *this)

{
  if (this != (GRULayerParams *)&_GRULayerParams_default_instance_) {
    if (this->updategateweightmatrix_ != (WeightParams *)0x0) {
      (*(this->updategateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->resetgateweightmatrix_ != (WeightParams *)0x0) {
      (*(this->resetgateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->outputgateweightmatrix_ != (WeightParams *)0x0) {
      (*(this->outputgateweightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->updategaterecursionmatrix_ != (WeightParams *)0x0) {
      (*(this->updategaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->resetgaterecursionmatrix_ != (WeightParams *)0x0) {
      (*(this->resetgaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->outputgaterecursionmatrix_ != (WeightParams *)0x0) {
      (*(this->outputgaterecursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->updategatebiasvector_ != (WeightParams *)0x0) {
      (*(this->updategatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->resetgatebiasvector_ != (WeightParams *)0x0) {
      (*(this->resetgatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->outputgatebiasvector_ != (WeightParams *)0x0) {
      (*(this->outputgatebiasvector_->super_MessageLite)._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void GRULayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete updategateweightmatrix_;
  }
  if (this != internal_default_instance()) {
    delete resetgateweightmatrix_;
  }
  if (this != internal_default_instance()) {
    delete outputgateweightmatrix_;
  }
  if (this != internal_default_instance()) {
    delete updategaterecursionmatrix_;
  }
  if (this != internal_default_instance()) {
    delete resetgaterecursionmatrix_;
  }
  if (this != internal_default_instance()) {
    delete outputgaterecursionmatrix_;
  }
  if (this != internal_default_instance()) {
    delete updategatebiasvector_;
  }
  if (this != internal_default_instance()) {
    delete resetgatebiasvector_;
  }
  if (this != internal_default_instance()) {
    delete outputgatebiasvector_;
  }
}